

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O2

int main(void)

{
  sqlite3_stmt *psVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  row_type *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  statement *psVar7;
  row_type *prVar8;
  row_type *prVar9;
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pqVar10;
  dynquery *pdVar11;
  long lVar12;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  int i;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *row;
  database dVar13;
  initializer_list<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  dynrow dVar14;
  database db1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [2];
  database db1_1;
  _Alloc_hider _Stack_2f0;
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Head_base<0UL,_int,_false> local_2a8;
  bool local_2a0;
  database db1_3;
  query<int> add1;
  bool local_210;
  database db1_6;
  database db1_12;
  query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> add2;
  bool local_198;
  statement inserter_assign;
  int col1;
  dynrow_iterator __begin1_1;
  
  sqlite3_open(":memory:",&db1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&add2,"select ?1+?2",(allocator<char> *)&db1_1);
  sqlib::query<int>::query(&add1,&db1,(string *)&add2);
  std::__cxx11::string::~string((string *)&add2);
  add2.super_statement_base.m_prepared =
       (sqlite3_stmt *)CONCAT44(add2.super_statement_base.m_prepared._4_4_,3);
  db1_1.m_sqlite._0_4_ = 4;
  sqlib::query<int>::operator()(&add1,(int *)&add2,(int *)&db1_1);
  if (add1.m_has_data == false) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x13);
    poVar4 = std::operator<<(poVar4,"\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(add1) == true");
    std::operator<<(poVar4,"\n");
  }
  if ((add1.m_has_data & 1U) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x14);
    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
    poVar4 = std::operator<<(poVar4,"has_data(add1)");
    std::operator<<(poVar4,"\n");
  }
  else {
    prVar5 = sqlib::query<int>::operator*(&add1);
    if ((prVar5->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>._M_head_impl != 7) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x14);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"std::get<0>(*add1) == 7");
      std::operator<<(poVar4,"\n");
    }
    sqlib::query<int>::operator++(&add1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&db1_1,"select ?1+?2",(allocator<char> *)&db1_3);
    sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    query(&add2,&db1,(string *)&db1_1);
    std::__cxx11::string::~string((string *)&db1_1);
    db1_1.m_sqlite._0_4_ = 3;
    db1_3.m_sqlite._0_4_ = 4;
    sqlib::query<std::__cxx11::string>::operator()(&add2,(int *)&db1_1,(int *)&db1_3);
    if (add2.m_has_data == false) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x18);
      poVar4 = std::operator<<(poVar4,"\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(add2) == true");
      std::operator<<(poVar4,"\n");
    }
    if ((add2.m_has_data & 1U) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x19);
      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
      poVar4 = std::operator<<(poVar4,"has_data(add2)");
      std::operator<<(poVar4,"\n");
    }
    else {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               sqlib::
               query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&add2);
      bVar2 = std::operator==(pbVar6,"7");
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x19);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"std::get<0>(*add2) == \"7\"");
        std::operator<<(poVar4,"\n");
      }
      sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&add2);
      sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~query(&add2);
      sqlib::statement_base::~statement_base(&add1.super_statement_base);
      sqlib::database::~database(&db1);
      sqlite3_open(":memory:",&db1_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&add2,"create table table1 (col1 integer, col2 text)",
                 (allocator<char> *)&add1);
      sqlib::database::execute_sql(&db1_1,(string *)&add2);
      std::__cxx11::string::~string((string *)&add2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&add1,"select col1,col2 from table1",(allocator<char> *)&db1);
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&add2,&db1_1,(string *)&add1);
      std::__cxx11::string::~string((string *)&add1);
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&add2);
      if (local_198 == true) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x23);
        poVar4 = std::operator<<(poVar4,"\n   ");
        poVar4 = std::operator<<(poVar4,"has_data(query1) == false");
        std::operator<<(poVar4,"\n");
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&add2);
      sqlib::database::~database(&db1_1);
      sqlite3_open(":memory:",&db1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&add2,"create table table1 (col1 integer, col2 text)",
                 (allocator<char> *)&add1);
      sqlib::database::execute_sql(&db1,(string *)&add2);
      std::__cxx11::string::~string((string *)&add2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&add2,"insert into table1 (col1,col2) values(?1,?2)",
                 (allocator<char> *)&db1_1);
      sqlib::statement_base::statement_base(&add1.super_statement_base,&db1,(string *)&add2);
      std::__cxx11::string::~string((string *)&add2);
      add2.super_statement_base.m_prepared =
           (sqlite3_stmt *)CONCAT44(add2.super_statement_base.m_prepared._4_4_,1);
      psVar7 = sqlib::statement::operator()((statement *)&add1,(int *)&add2,(char (*) [6])"first");
      db1_1.m_sqlite._0_4_ = 2;
      psVar7 = sqlib::statement::operator()(psVar7,(int *)&db1_1,(char (*) [7])"second");
      db1_3.m_sqlite._0_4_ = 3;
      sqlib::statement::operator()(psVar7,(int *)&db1_3,(char (*) [6])"third");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&db1_1,"select col1,col2 from table1 order by col1 asc",
                 (allocator<char> *)&db1_3);
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&add2,&db1,(string *)&db1_1);
      std::__cxx11::string::~string((string *)&db1_1);
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&add2);
      if (local_198 == false) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                );
        poVar4 = std::operator<<(poVar4,':');
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
        poVar4 = std::operator<<(poVar4,"has_data(query1)");
        std::operator<<(poVar4,"\n");
      }
      else {
        prVar8 = sqlib::
                 query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&add2);
        if ((prVar8->
            super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super__Head_base<0UL,_int,_false>._M_head_impl != 1) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
          std::operator<<(poVar4,"\n");
        }
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 sqlib::
                 query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&add2);
        bVar2 = std::operator==(pbVar6,"first");
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
          poVar4 = std::operator<<(poVar4,"\n   ");
          poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"first\"");
          std::operator<<(poVar4,"\n");
        }
        sqlib::
        query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&add2);
        if (local_198 == false) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,':');
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x31);
          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
          poVar4 = std::operator<<(poVar4,"has_data(query1)");
          std::operator<<(poVar4,"\n");
        }
        else {
          prVar8 = sqlib::
                   query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&add2);
          if ((prVar8->
              super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).super__Head_base<0UL,_int,_false>._M_head_impl != 2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x31);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
            std::operator<<(poVar4,"\n");
          }
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   sqlib::
                   query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&add2);
          bVar2 = std::operator==(pbVar6,"second");
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x31);
            poVar4 = std::operator<<(poVar4,"\n   ");
            poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"second\"");
            std::operator<<(poVar4,"\n");
          }
          sqlib::
          query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&add2);
          if (local_198 == false) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,':');
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
            poVar4 = std::operator<<(poVar4," (fatal)\n   ");
            poVar4 = std::operator<<(poVar4,"has_data(query1)");
            std::operator<<(poVar4,"\n");
          }
          else {
            prVar8 = sqlib::
                     query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&add2);
            if ((prVar8->
                super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).super__Head_base<0UL,_int,_false>._M_head_impl != 3) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
              poVar4 = std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,':');
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
              poVar4 = std::operator<<(poVar4,"\n   ");
              poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 3");
              std::operator<<(poVar4,"\n");
            }
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     sqlib::
                     query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&add2);
            bVar2 = std::operator==(pbVar6,"third");
            if (!bVar2) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
              poVar4 = std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,':');
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
              poVar4 = std::operator<<(poVar4,"\n   ");
              poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"third\"");
              std::operator<<(poVar4,"\n");
            }
            sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&add2);
            if (local_198 == true) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
              poVar4 = std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,':');
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x33);
              poVar4 = std::operator<<(poVar4," (fatal)\n   ");
              poVar4 = std::operator<<(poVar4,"!has_data(query1)");
              std::operator<<(poVar4,"\n");
            }
            else {
              sqlib::
              query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&add2);
              sqlib::statement_base::~statement_base(&add1.super_statement_base);
              sqlib::database::~database(&db1);
              sqlite3_open(":memory:",&db1_3);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&add2,"create table table1 (col1 integer, col2 text)",
                         (allocator<char> *)&add1);
              sqlib::database::execute_sql(&db1_3,(string *)&add2);
              std::__cxx11::string::~string((string *)&add2);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&add2,"insert into table1 (col1,col2) values(?1,?2)",
                         (allocator<char> *)&db1_1);
              sqlib::statement_base::statement_base
                        (&add1.super_statement_base,&db1_3,(string *)&add2);
              std::__cxx11::string::~string((string *)&add2);
              add2.super_statement_base.m_prepared =
                   (sqlite3_stmt *)CONCAT44(add2.super_statement_base.m_prepared._4_4_,1);
              psVar7 = sqlib::statement::operator()
                                 ((statement *)&add1,(int *)&add2,(char (*) [6])"first");
              db1_1.m_sqlite._0_4_ = 2;
              psVar7 = sqlib::statement::operator()(psVar7,(int *)&db1_1,(char (*) [7])"second");
              db1.m_sqlite._0_4_ = 3;
              sqlib::statement::operator()(psVar7,(int *)&db1,(char (*) [6])"third");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&add2,"update table1 set col2=?1 where col1=?2",
                         (allocator<char> *)&db1);
              sqlib::statement_base::statement_base((statement_base *)&db1_1,&db1_3,(string *)&add2)
              ;
              std::__cxx11::string::~string((string *)&add2);
              add2.super_statement_base.m_prepared =
                   (sqlite3_stmt *)CONCAT44(add2.super_statement_base.m_prepared._4_4_,1);
              psVar7 = sqlib::statement::operator()
                                 ((statement *)&db1_1,(char (*) [4])"uno",(int *)&add2);
              iVar3 = sqlib::statement::affected_rows(psVar7);
              if (iVar3 != 1) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                poVar4 = std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                        );
                poVar4 = std::operator<<(poVar4,':');
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3f);
                poVar4 = std::operator<<(poVar4,"\n   ");
                poVar4 = std::operator<<(poVar4,"update1(\"uno\",1).affected_rows() == 1");
                std::operator<<(poVar4,"\n");
              }
              add2.super_statement_base.m_prepared =
                   (sqlite3_stmt *)CONCAT44(add2.super_statement_base.m_prepared._4_4_,2);
              psVar7 = sqlib::statement::operator()
                                 ((statement *)&db1_1,(char (*) [4])"dos",(int *)&add2);
              iVar3 = sqlib::statement::affected_rows(psVar7);
              if (iVar3 != 1) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                poVar4 = std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                        );
                poVar4 = std::operator<<(poVar4,':');
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x40);
                poVar4 = std::operator<<(poVar4,"\n   ");
                poVar4 = std::operator<<(poVar4,"update1(\"dos\",2).affected_rows() == 1");
                std::operator<<(poVar4,"\n");
              }
              add2.super_statement_base.m_prepared =
                   (sqlite3_stmt *)CONCAT44(add2.super_statement_base.m_prepared._4_4_,3);
              psVar7 = sqlib::statement::operator()
                                 ((statement *)&db1_1,(char (*) [5])"tres",(int *)&add2);
              iVar3 = sqlib::statement::affected_rows(psVar7);
              if (iVar3 != 1) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                poVar4 = std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                        );
                poVar4 = std::operator<<(poVar4,':');
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x41);
                poVar4 = std::operator<<(poVar4,"\n   ");
                poVar4 = std::operator<<(poVar4,"update1(\"tres\",3).affected_rows() == 1");
                std::operator<<(poVar4,"\n");
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&db1,"select col1, col2 from table1 order by col1 asc",
                         (allocator<char> *)&inserter_assign);
              sqlib::
              query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&add2,&db1_3,(string *)&db1);
              std::__cxx11::string::~string((string *)&db1);
              sqlib::
              query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&add2);
              if (local_198 == false) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                poVar4 = std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                        );
                poVar4 = std::operator<<(poVar4,':');
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
                poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                poVar4 = std::operator<<(poVar4,"has_data(query1)");
                std::operator<<(poVar4,"\n");
              }
              else {
                prVar8 = sqlib::
                         query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&add2);
                if ((prVar8->
                    super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).super__Head_base<0UL,_int,_false>._M_head_impl != 1) {
                  poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                  poVar4 = std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                          );
                  poVar4 = std::operator<<(poVar4,':');
                  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
                  poVar4 = std::operator<<(poVar4,"\n   ");
                  poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
                  std::operator<<(poVar4,"\n");
                }
                pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         sqlib::
                         query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&add2);
                bVar2 = std::operator==(pbVar6,"uno");
                if (!bVar2) {
                  poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                  poVar4 = std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                          );
                  poVar4 = std::operator<<(poVar4,':');
                  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
                  poVar4 = std::operator<<(poVar4,"\n   ");
                  poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"uno\"");
                  std::operator<<(poVar4,"\n");
                }
                sqlib::
                query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&add2);
                if (local_198 == false) {
                  poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                  poVar4 = std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                          );
                  poVar4 = std::operator<<(poVar4,':');
                  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                  poVar4 = std::operator<<(poVar4,"has_data(query1)");
                  std::operator<<(poVar4,"\n");
                }
                else {
                  prVar8 = sqlib::
                           query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&add2);
                  if ((prVar8->
                      super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).super__Head_base<0UL,_int,_false>._M_head_impl != 2) {
                    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                    poVar4 = std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                            );
                    poVar4 = std::operator<<(poVar4,':');
                    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
                    poVar4 = std::operator<<(poVar4,"\n   ");
                    poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
                    std::operator<<(poVar4,"\n");
                  }
                  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           sqlib::
                           query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&add2);
                  bVar2 = std::operator==(pbVar6,"dos");
                  if (!bVar2) {
                    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                    poVar4 = std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                            );
                    poVar4 = std::operator<<(poVar4,':');
                    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
                    poVar4 = std::operator<<(poVar4,"\n   ");
                    poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"dos\"");
                    std::operator<<(poVar4,"\n");
                  }
                  sqlib::
                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&add2);
                  if (local_198 == false) {
                    poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                    poVar4 = std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                            );
                    poVar4 = std::operator<<(poVar4,':');
                    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x47);
                    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                    poVar4 = std::operator<<(poVar4,"has_data(query1)");
                    std::operator<<(poVar4,"\n");
                  }
                  else {
                    prVar8 = sqlib::
                             query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&add2);
                    if ((prVar8->
                        super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).super__Head_base<0UL,_int,_false>._M_head_impl != 3) {
                      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                      poVar4 = std::operator<<(poVar4,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                              );
                      poVar4 = std::operator<<(poVar4,':');
                      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x47);
                      poVar4 = std::operator<<(poVar4,"\n   ");
                      poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 3");
                      std::operator<<(poVar4,"\n");
                    }
                    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             sqlib::
                             query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&add2);
                    bVar2 = std::operator==(pbVar6,"tres");
                    if (!bVar2) {
                      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                      poVar4 = std::operator<<(poVar4,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                              );
                      poVar4 = std::operator<<(poVar4,':');
                      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x47);
                      poVar4 = std::operator<<(poVar4,"\n   ");
                      poVar4 = std::operator<<(poVar4,"std::get<1>(*query1) == \"tres\"");
                      std::operator<<(poVar4,"\n");
                    }
                    sqlib::
                    query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&add2);
                    if (local_198 == true) {
                      poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                      poVar4 = std::operator<<(poVar4,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                              );
                      poVar4 = std::operator<<(poVar4,':');
                      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x48);
                      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
                      std::operator<<(poVar4,"\n");
                    }
                    else {
                      sqlib::
                      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~query((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&add2);
                      sqlib::statement_base::~statement_base((statement_base *)&db1_1);
                      sqlib::statement_base::~statement_base(&add1.super_statement_base);
                      sqlib::database::~database(&db1_3);
                      sqlite3_open(":memory:",&db1_3);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&add2,"create table table1 (col1 integer, col2 text)",
                                 (allocator<char> *)&add1);
                      sqlib::database::execute_sql(&db1_3,(string *)&add2);
                      std::__cxx11::string::~string((string *)&add2);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&add2,"insert into table1 (col1,col2) values(?1,?2)",
                                 (allocator<char> *)&db1_1);
                      sqlib::statement_base::statement_base
                                (&add1.super_statement_base,&db1_3,(string *)&add2);
                      std::__cxx11::string::~string((string *)&add2);
                      add2.super_statement_base.m_prepared =
                           (sqlite3_stmt *)CONCAT44(add2.super_statement_base.m_prepared._4_4_,1);
                      psVar7 = sqlib::statement::operator()
                                         ((statement *)&add1,(int *)&add2,(char (*) [6])"first");
                      db1_1.m_sqlite._0_4_ = 2;
                      psVar7 = sqlib::statement::operator()
                                         (psVar7,(int *)&db1_1,(char (*) [7])"second");
                      db1.m_sqlite._0_4_ = 3;
                      sqlib::statement::operator()(psVar7,(int *)&db1,(char (*) [6])"third");
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&add2,"delete from table1 where col2=?1",
                                 (allocator<char> *)&db1);
                      sqlib::statement_base::statement_base
                                ((statement_base *)&db1_1,&db1_3,(string *)&add2);
                      std::__cxx11::string::~string((string *)&add2);
                      psVar7 = sqlib::statement::operator()
                                         ((statement *)&db1_1,(char (*) [6])"third");
                      iVar3 = sqlib::statement::affected_rows(psVar7);
                      if (iVar3 != 1) {
                        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                        poVar4 = std::operator<<(poVar4,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                );
                        poVar4 = std::operator<<(poVar4,':');
                        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x54);
                        poVar4 = std::operator<<(poVar4,"\n   ");
                        poVar4 = std::operator<<(poVar4,"delete1(\"third\").affected_rows() == 1");
                        std::operator<<(poVar4,"\n");
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&db1,"select col2 from table1 order by col1 asc",
                                 (allocator<char> *)&inserter_assign);
                      sqlib::
                      query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::query(&add2,&db1_3,(string *)&db1);
                      std::__cxx11::string::~string((string *)&db1);
                      sqlib::
                      query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()<>(&add2);
                      if (add2.m_has_data == false) {
                        poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                        poVar4 = std::operator<<(poVar4,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                );
                        poVar4 = std::operator<<(poVar4,':');
                        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x59);
                        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                        poVar4 = std::operator<<(poVar4,"has_data(query1)");
                        std::operator<<(poVar4,"\n");
                      }
                      else {
                        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)sqlib::
                                    query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator*(&add2);
                        bVar2 = std::operator==(pbVar6,"first");
                        if (!bVar2) {
                          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                          poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                          poVar4 = std::operator<<(poVar4,':');
                          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5a);
                          poVar4 = std::operator<<(poVar4,"\n   ");
                          poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == \"first\"");
                          std::operator<<(poVar4,"\n");
                        }
                        sqlib::
                        query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++(&add2);
                        if (add2.m_has_data == false) {
                          poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                          poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                          poVar4 = std::operator<<(poVar4,':');
                          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5b);
                          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                          poVar4 = std::operator<<(poVar4,"has_data(query1)");
                          std::operator<<(poVar4,"\n");
                        }
                        else {
                          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)sqlib::
                                      query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator*(&add2);
                          bVar2 = std::operator==(pbVar6,"second");
                          if (!bVar2) {
                            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                            poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                            poVar4 = std::operator<<(poVar4,':');
                            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5b);
                            poVar4 = std::operator<<(poVar4,"\n   ");
                            poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == \"second\"");
                            std::operator<<(poVar4,"\n");
                          }
                          sqlib::
                          query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++(&add2);
                          if (add2.m_has_data == true) {
                            poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                            poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                            poVar4 = std::operator<<(poVar4,':');
                            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5c);
                            poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                            poVar4 = std::operator<<(poVar4,"!has_data(query1)");
                            std::operator<<(poVar4,"\n");
                          }
                          else {
                            psVar7 = sqlib::statement::operator()
                                               ((statement *)&db1_1,(char (*) [6])"first");
                            iVar3 = sqlib::statement::affected_rows(psVar7);
                            if (iVar3 != 1) {
                              poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                              poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                              poVar4 = std::operator<<(poVar4,':');
                              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5e);
                              poVar4 = std::operator<<(poVar4,"\n   ");
                              poVar4 = std::operator<<(poVar4,
                                                  "delete1(\"first\").affected_rows() == 1");
                              std::operator<<(poVar4,"\n");
                            }
                            psVar7 = sqlib::statement::operator()
                                               ((statement *)&db1_1,(char (*) [7])"second");
                            iVar3 = sqlib::statement::affected_rows(psVar7);
                            if (iVar3 != 1) {
                              poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                              poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                              poVar4 = std::operator<<(poVar4,':');
                              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5f);
                              poVar4 = std::operator<<(poVar4,"\n   ");
                              poVar4 = std::operator<<(poVar4,
                                                  "delete1(\"second\").affected_rows() == 1");
                              std::operator<<(poVar4,"\n");
                            }
                            sqlib::
                            query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()<>(&add2);
                            if (add2.m_has_data == true) {
                              poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                              poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                              poVar4 = std::operator<<(poVar4,':');
                              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x62);
                              poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                              poVar4 = std::operator<<(poVar4,"!has_data(query1)");
                              std::operator<<(poVar4,"\n");
                            }
                            else {
                              sqlib::
                              query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~query(&add2);
                              sqlib::statement_base::~statement_base((statement_base *)&db1_1);
                              sqlib::statement_base::~statement_base(&add1.super_statement_base);
                              sqlib::database::~database(&db1_3);
                              sqlite3_open(":memory:",&db1);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&add2,
                                         "create table table1 (col1 integer, col2 text)",
                                         (allocator<char> *)&add1);
                              sqlib::database::execute_sql(&db1,(string *)&add2);
                              std::__cxx11::string::~string((string *)&add2);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&add2,
                                         "insert into table1 (col1,col2) values(?1,?2)",
                                         (allocator<char> *)&db1_1);
                              sqlib::statement_base::statement_base
                                        (&add1.super_statement_base,&db1,(string *)&add2);
                              std::__cxx11::string::~string((string *)&add2);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&db1_1,
                                         "select col1 from table1 order by col1 asc",
                                         (allocator<char> *)&db1_3);
                              sqlib::query<int>::query((query<int> *)&add2,&db1,(string *)&db1_1);
                              std::__cxx11::string::~string((string *)&db1_1);
                              sqlib::transaction_lock::transaction_lock
                                        ((transaction_lock *)&db1_1,&db1);
                              db1_3.m_sqlite._0_4_ = 1;
                              psVar7 = sqlib::statement::operator()
                                                 ((statement *)&add1,(int *)&db1_3,
                                                  (char (*) [6])"first");
                              iVar3 = sqlib::statement::affected_rows(psVar7);
                              if (iVar3 != 1) {
                                poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                                poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                poVar4 = std::operator<<(poVar4,':');
                                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6f)
                                ;
                                poVar4 = std::operator<<(poVar4,"\n   ");
                                poVar4 = std::operator<<(poVar4,
                                                  "insert(1,\"first\").affected_rows() == 1");
                                std::operator<<(poVar4,"\n");
                              }
                              db1_3.m_sqlite._0_4_ = 2;
                              psVar7 = sqlib::statement::operator()
                                                 ((statement *)&add1,(int *)&db1_3,
                                                  (char (*) [7])"second");
                              iVar3 = sqlib::statement::affected_rows(psVar7);
                              if (iVar3 != 1) {
                                poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                                poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                poVar4 = std::operator<<(poVar4,':');
                                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x70)
                                ;
                                poVar4 = std::operator<<(poVar4,"\n   ");
                                poVar4 = std::operator<<(poVar4,
                                                  "insert(2,\"second\").affected_rows() == 1");
                                std::operator<<(poVar4,"\n");
                              }
                              sqlib::query<int>::operator()<>((query<int> *)&add2);
                              if (add2.m_row.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                  ._M_head_impl._M_dataplus._M_p._4_1_ == '\0') {
                                poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ");
                                poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                poVar4 = std::operator<<(poVar4,':');
                                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x73)
                                ;
                                poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                poVar4 = std::operator<<(poVar4,"has_data(query1)");
                                std::operator<<(poVar4,"\n");
                              }
                              else {
                                prVar5 = sqlib::query<int>::operator*((query<int> *)&add2);
                                if ((prVar5->super__Tuple_impl<0UL,_int>).
                                    super__Head_base<0UL,_int,_false>._M_head_impl != 1) {
                                  poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ")
                                  ;
                                  poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                  poVar4 = std::operator<<(poVar4,':');
                                  poVar4 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar4,0x73);
                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                  poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 1");
                                  std::operator<<(poVar4,"\n");
                                }
                                sqlib::query<int>::operator++((query<int> *)&add2);
                                if (add2.m_row.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                    ._M_head_impl._M_dataplus._M_p._4_1_ == '\0') {
                                  poVar4 = std::operator<<((ostream *)&std::cerr,"Check failed on ")
                                  ;
                                  poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                  poVar4 = std::operator<<(poVar4,':');
                                  poVar4 = (ostream *)
                                           std::ostream::operator<<((ostream *)poVar4,0x74);
                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                  poVar4 = std::operator<<(poVar4,"has_data(query1)");
                                  std::operator<<(poVar4,"\n");
                                }
                                else {
                                  prVar5 = sqlib::query<int>::operator*((query<int> *)&add2);
                                  if ((prVar5->super__Tuple_impl<0UL,_int>).
                                      super__Head_base<0UL,_int,_false>._M_head_impl != 2) {
                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                             "Check failed on ");
                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                    poVar4 = std::operator<<(poVar4,':');
                                    poVar4 = (ostream *)
                                             std::ostream::operator<<((ostream *)poVar4,0x74);
                                    poVar4 = std::operator<<(poVar4,"\n   ");
                                    poVar4 = std::operator<<(poVar4,"std::get<0>(*query1) == 2");
                                    std::operator<<(poVar4,"\n");
                                  }
                                  sqlib::query<int>::operator++((query<int> *)&add2);
                                  if (add2.m_row.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                      ._M_head_impl._M_dataplus._M_p._4_1_ == '\x01') {
                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                             "Check failed on ");
                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                    poVar4 = std::operator<<(poVar4,':');
                                    poVar4 = (ostream *)
                                             std::ostream::operator<<((ostream *)poVar4,0x75);
                                    poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                    poVar4 = std::operator<<(poVar4,"!has_data(query1)");
                                    std::operator<<(poVar4,"\n");
                                  }
                                  else {
                                    sqlib::transaction_lock::~transaction_lock
                                              ((transaction_lock *)&db1_1);
                                    sqlib::query<int>::operator()<>((query<int> *)&add2);
                                    if (add2.m_row.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                        ._M_head_impl._M_dataplus._M_p._4_1_ == '\x01') {
                                      poVar4 = std::operator<<((ostream *)&std::cerr,
                                                               "Check failed on ");
                                      poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                      poVar4 = std::operator<<(poVar4,':');
                                      poVar4 = (ostream *)
                                               std::ostream::operator<<((ostream *)poVar4,0x7b);
                                      poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                      poVar4 = std::operator<<(poVar4,"!has_data(query1)");
                                      std::operator<<(poVar4,"\n");
                                    }
                                    else {
                                      sqlib::transaction_lock::transaction_lock
                                                ((transaction_lock *)&db1_1,&db1);
                                      db1_3.m_sqlite._0_4_ = 1;
                                      sqlib::statement::operator()
                                                ((statement *)&add1,(int *)&db1_3,
                                                 (char (*) [6])"first");
                                      sqlib::query<int>::operator()<>((query<int> *)&add2);
                                      if (add2.m_row.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                          ._M_head_impl._M_dataplus._M_p._4_1_ == '\0') {
                                        poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                 "Check failed on ");
                                        poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                        poVar4 = std::operator<<(poVar4,':');
                                        poVar4 = (ostream *)
                                                 std::ostream::operator<<((ostream *)poVar4,0x83);
                                        poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                        poVar4 = std::operator<<(poVar4,"has_data(query1)");
                                        std::operator<<(poVar4,"\n");
                                      }
                                      else {
                                        prVar5 = sqlib::query<int>::operator*((query<int> *)&add2);
                                        if ((prVar5->super__Tuple_impl<0UL,_int>).
                                            super__Head_base<0UL,_int,_false>._M_head_impl != 1) {
                                          poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                   "Check failed on ");
                                          poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                          poVar4 = std::operator<<(poVar4,':');
                                          poVar4 = (ostream *)
                                                   std::ostream::operator<<((ostream *)poVar4,0x83);
                                          poVar4 = std::operator<<(poVar4,"\n   ");
                                          poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 1");
                                          std::operator<<(poVar4,"\n");
                                        }
                                        sqlib::query<int>::operator++((query<int> *)&add2);
                                        if (add2.m_row.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                            ._M_head_impl._M_dataplus._M_p._4_1_ == '\x01') {
                                          poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                   "Check failed on ");
                                          poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                          poVar4 = std::operator<<(poVar4,':');
                                          poVar4 = (ostream *)
                                                   std::ostream::operator<<((ostream *)poVar4,0x84);
                                          poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                          poVar4 = std::operator<<(poVar4,"!has_data(query1)");
                                          std::operator<<(poVar4,"\n");
                                        }
                                        else {
                                          sqlib::query<int>::operator()<>((query<int> *)&add2);
                                          sqlib::transaction_lock::commit
                                                    ((transaction_lock *)&db1_1);
                                          if (add2.m_row.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                              ._M_head_impl._M_dataplus._M_p._4_1_ == '\0') {
                                            poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                     "Check failed on ");
                                            poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                            poVar4 = std::operator<<(poVar4,':');
                                            poVar4 = (ostream *)
                                                     std::ostream::operator<<
                                                               ((ostream *)poVar4,0x89);
                                            poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                            poVar4 = std::operator<<(poVar4,"has_data(query1)");
                                            std::operator<<(poVar4,"\n");
                                          }
                                          else {
                                            prVar5 = sqlib::query<int>::operator*
                                                               ((query<int> *)&add2);
                                            if ((prVar5->super__Tuple_impl<0UL,_int>).
                                                super__Head_base<0UL,_int,_false>._M_head_impl != 1)
                                            {
                                              poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                       "Check failed on ");
                                              poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                              poVar4 = std::operator<<(poVar4,':');
                                              poVar4 = (ostream *)
                                                       std::ostream::operator<<
                                                                 ((ostream *)poVar4,0x89);
                                              poVar4 = std::operator<<(poVar4,"\n   ");
                                              poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 1");
                                              std::operator<<(poVar4,"\n");
                                            }
                                            sqlib::query<int>::operator++((query<int> *)&add2);
                                            if (add2.m_row.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                                ._M_head_impl._M_dataplus._M_p._4_1_ == '\x01') {
                                              poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                       "Check failed on ");
                                              poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                              poVar4 = std::operator<<(poVar4,':');
                                              poVar4 = (ostream *)
                                                       std::ostream::operator<<
                                                                 ((ostream *)poVar4,0x8a);
                                              poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                              poVar4 = std::operator<<(poVar4,"!has_data(query1)");
                                              std::operator<<(poVar4,"\n");
                                            }
                                            else {
                                              sqlib::transaction_lock::~transaction_lock
                                                        ((transaction_lock *)&db1_1);
                                              sqlib::query<int>::operator()<>((query<int> *)&add2);
                                              if (add2.m_row.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                                  ._M_head_impl._M_dataplus._M_p._4_1_ == '\0') {
                                                poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                         "Check failed on ");
                                                poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                poVar4 = std::operator<<(poVar4,':');
                                                poVar4 = (ostream *)
                                                         std::ostream::operator<<
                                                                   ((ostream *)poVar4,0x8e);
                                                poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                poVar4 = std::operator<<(poVar4,"has_data(query1)");
                                                std::operator<<(poVar4,"\n");
                                              }
                                              else {
                                                prVar5 = sqlib::query<int>::operator*
                                                                   ((query<int> *)&add2);
                                                if ((prVar5->super__Tuple_impl<0UL,_int>).
                                                    super__Head_base<0UL,_int,_false>._M_head_impl
                                                    != 1) {
                                                  poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                           "Check failed on ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0x8e);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 1");
                                                  std::operator<<(poVar4,"\n");
                                                }
                                                sqlib::query<int>::operator++((query<int> *)&add2);
                                                if (add2.m_row.
                                                                                                        
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                                  ._M_head_impl._M_dataplus._M_p._4_1_ == '\x01') {
                                                  poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                           "Check failed on ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0x8f);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query1)");
                                                  std::operator<<(poVar4,"\n");
                                                }
                                                else {
                                                  sqlib::statement_base::~statement_base
                                                            (&add2.super_statement_base);
                                                  sqlib::statement_base::~statement_base
                                                            (&add1.super_statement_base);
                                                  sqlib::database::~database(&db1);
                                                  sqlite3_open(":memory:",&db1_6);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add2,
                                                                                                                          
                                                  "create table table1 (col1 integer, col2 text)",
                                                  (allocator<char> *)&add1);
                                                  sqlib::database::execute_sql
                                                            (&db1_6,(string *)&add2);
                                                  std::__cxx11::string::~string((string *)&add2);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add2,
                                                                                                                          
                                                  "insert into table1 (col1,col2) values(?1,?2)",
                                                  (allocator<char> *)&add1);
                                                  sqlib::statement_base::statement_base
                                                            ((statement_base *)&db1,&db1_6,
                                                             (string *)&add2);
                                                  std::__cxx11::string::~string((string *)&add2);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add1,
                                                                                                                          
                                                  "select col1,col2 from table1 order by col1 asc",
                                                  (allocator<char> *)&db1_1);
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::query((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2,&db1_6,(string *)&add1);
                                                  std::__cxx11::string::~string((string *)&add1);
                                                  add1.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)
                                                       CONCAT44(add1.super_statement_base.m_prepared
                                                                ._4_4_,1);
                                                  sqlib::statement::operator()
                                                            ((statement *)&db1,(int *)&add1,
                                                             (char (*) [6])"first");
                                                  sqlib::statement_base::statement_base
                                                            ((statement_base *)&db1_3,
                                                             (statement_base *)&db1);
                                                  add1.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)
                                                       CONCAT44(add1.super_statement_base.m_prepared
                                                                ._4_4_,2);
                                                  sqlib::statement::operator()
                                                            ((statement *)&db1_3,(int *)&add1,
                                                             (char (*) [7])"second");
                                                  inserter_assign.super_statement_base.m_sql.
                                                  _M_dataplus._M_p =
                                                       (pointer)&inserter_assign.
                                                                 super_statement_base.m_sql.field_2;
                                                  inserter_assign.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)0x0;
                                                  inserter_assign.super_statement_base.m_db =
                                                       (sqlite3 *)0x0;
                                                  inserter_assign.super_statement_base.m_sql.
                                                  _M_string_length = 0;
                                                  inserter_assign.super_statement_base.m_sql.field_2
                                                  ._M_local_buf[0] = '\0';
                                                  sqlib::statement_base::operator=
                                                            (&inserter_assign.super_statement_base,
                                                             (statement_base *)&db1);
                                                  add1.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)
                                                       CONCAT44(add1.super_statement_base.m_prepared
                                                                ._4_4_,3);
                                                  sqlib::statement::operator()
                                                            (&inserter_assign,(int *)&add1,
                                                             (char (*) [6])"third");
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()<>((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (local_198 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa5);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 1) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa5);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 1");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  bVar2 = std::operator==(pbVar6,"first");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa5);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query1) == \"first\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (local_198 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa6);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa6);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 2");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  bVar2 = std::operator==(pbVar6,"second");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa6);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query1) == \"second\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (local_198 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa7);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 3) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa7);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 3");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  bVar2 = std::operator==(pbVar6,"third");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa7);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query1) == \"third\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (local_198 == true) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xa8);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query1)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()<>((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (local_198 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xab);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 1) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xab);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 1");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  bVar2 = std::operator==(pbVar6,"first");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xab);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query1) == \"first\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::query((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1,(
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (local_210 == true) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xae);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query_copy)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else if (local_198 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb0);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb0);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 2");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  bVar2 = std::operator==(pbVar6,"second");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb0);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query1) == \"second\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()<>((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  if (local_210 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb3);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "has_data(query_copy)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 1) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb3);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query_copy) == 1");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  bVar2 = std::operator==(pbVar6,"first");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb3);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query_copy) == \"first\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  if (local_210 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb4);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "has_data(query_copy)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb4);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query_copy) == 2");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  bVar2 = std::operator==(pbVar6,"second");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb4);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query_copy) == \"second\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  if (local_210 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb5);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "has_data(query_copy)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 3) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb5);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query_copy) == 3");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  bVar2 = std::operator==(pbVar6,"third");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb5);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query_copy) == \"third\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  if (local_210 == true) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xb6);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query_copy)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    local_2e8._0_8_ = &local_2d8;
                                                    db1_1.m_sqlite = (sqlite3 *)0x0;
                                                    _Stack_2f0._M_p = (pointer)0x0;
                                                    local_2e8._8_8_ = 0;
                                                    local_2d8._M_local_buf[0] = '\0';
                                                    local_2c8._M_p = (pointer)&local_2b8;
                                                    local_2c0 = 0;
                                                    local_2b8._M_local_buf[0] = '\0';
                                                    local_2a8._M_head_impl = 0;
                                                    sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator=((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1,(
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (local_2a0 == true) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xba);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query_assignment)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()<>((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  if (local_2a0 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbd);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "has_data(query_assignment)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 1) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbd);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query_assignment) == 1");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  bVar2 = std::operator==(pbVar6,"first");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbd);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query_assignment) == \"first\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  if (local_2a0 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbe);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "has_data(query_assignment)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbe);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query_assignment) == 2");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  bVar2 = std::operator==(pbVar6,"second");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbe);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query_assignment) == \"second\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  if (local_2a0 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbf);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "has_data(query_assignment)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 3) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbf);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query_assignment) == 3");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  bVar2 = std::operator==(pbVar6,"third");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xbf);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query_assignment) == \"third\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  if (local_2a0 == true) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xc0);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query_assignment)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else if (local_198 == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xc2);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar8 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if ((prVar8->
                                                  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 3) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xc2);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 3");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  bVar2 = std::operator==(pbVar6,"third");
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xc2);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query1) == \"third\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (local_198 == true) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xc3);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query1)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~query((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~query((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add1);
                                                  sqlib::statement_base::~statement_base
                                                            (&inserter_assign.super_statement_base);
                                                  sqlib::statement_base::~statement_base
                                                            ((statement_base *)&db1_3);
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~query((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  sqlib::statement_base::~statement_base
                                                            ((statement_base *)&db1);
                                                  sqlib::database::~database(&db1_6);
                                                  sqlite3_open(":memory:",&db1_3);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add2,
                                                                                                                          
                                                  "create table table1 (col1 integer, col2 blob)",
                                                  (allocator<char> *)&add1);
                                                  sqlib::database::execute_sql
                                                            (&db1_3,(string *)&add2);
                                                  std::__cxx11::string::~string((string *)&add2);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add2,
                                                                                                                          
                                                  "insert into table1 (col1,col2) values(?1,?2)",
                                                  (allocator<char> *)&db1_1);
                                                  sqlib::statement_base::statement_base
                                                            (&add1.super_statement_base,&db1_3,
                                                             (string *)&add2);
                                                  std::__cxx11::string::~string((string *)&add2);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&db1_1,
                                                                                                                          
                                                  "select col1,col2 from table1 order by col1 asc",
                                                  (allocator<char> *)&db1);
                                                  sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::query((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2,&db1_3,(string *)&db1_1);
                                                  std::__cxx11::string::~string((string *)&db1_1);
                                                  local_2e8._0_8_ =
                                                       (
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)0x0;
                                                  local_318[0]._M_allocated_capacity = 0;
                                                  db1_1.m_sqlite = (sqlite3 *)0x0;
                                                  _Stack_2f0._M_p = (pointer)0x0;
                                                  db1.m_sqlite = (sqlite3 *)0x0;
                                                  for (iVar3 = 0; iVar3 != 0x100; iVar3 = iVar3 + 1)
                                                  {
                                                    inserter_assign.super_statement_base.m_prepared
                                                         = (sqlite3_stmt *)
                                                           CONCAT71(inserter_assign.
                                                                    super_statement_base.m_prepared.
                                                                    _1_7_,(char)iVar3);
                                                    std::vector<char,_std::allocator<char>_>::
                                                    emplace_back<char>((
                                                  vector<char,_std::allocator<char>_> *)&db1_1,
                                                  (char *)&inserter_assign);
                                                  }
                                                  inserter_assign.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)
                                                       CONCAT44(inserter_assign.super_statement_base
                                                                .m_prepared._4_4_,1);
                                                  sqlib::statement::operator()
                                                            ((statement *)&add1,
                                                             (int *)&inserter_assign,
                                                             (vector<char,_std::allocator<char>_> *)
                                                             &db1_1);
                                                  inserter_assign.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)
                                                       CONCAT44(inserter_assign.super_statement_base
                                                                .m_prepared._4_4_,2);
                                                  sqlib::statement::operator()
                                                            ((statement *)&add1,
                                                             (int *)&inserter_assign,
                                                             (vector<char,_std::allocator<char>_> *)
                                                             &db1);
                                                  sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::operator()<>((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (add2.m_has_data == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xd8);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar9 = sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if ((prVar9->
                                                  super__Tuple_impl<0UL,_int,_std::vector<char,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 1) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xd8);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 1");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  prVar9 = sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  bVar2 = operator==((blob_type *)prVar9,
                                                                     (blob_type *)&db1_1);
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xd8);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query1) == blob");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (add2.m_has_data == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xd9);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar9 = sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if ((prVar9->
                                                  super__Tuple_impl<0UL,_int,_std::vector<char,_std::allocator<char>_>_>
                                                  ).super__Head_base<0UL,_int,_false>._M_head_impl
                                                  != 2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xd9);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 2");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  prVar9 = sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  bVar2 = operator==((blob_type *)prVar9,
                                                                     (blob_type *)&db1);
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xd9);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<1>(*query1) == empty_blob");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  if (add2.m_has_data == true) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xda);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query1)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    std::_Vector_base<char,_std::allocator<char>_>::
                                                    ~_Vector_base((
                                                  _Vector_base<char,_std::allocator<char>_> *)&db1);
                                                  std::_Vector_base<char,_std::allocator<char>_>::
                                                  ~_Vector_base((
                                                  _Vector_base<char,_std::allocator<char>_> *)&db1_1
                                                  );
                                                  sqlib::
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  ::~query((
                                                  query<int,_std::vector<char,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  sqlib::statement_base::~statement_base
                                                            (&add1.super_statement_base);
                                                  sqlib::database::~database(&db1_3);
                                                  sqlite3_open(":memory:",&add2);
                                                  sqlite3_open(":memory:",&add1);
                                                  psVar1 = add2.super_statement_base.m_prepared;
                                                  add2.super_statement_base.m_prepared =
                                                       add1.super_statement_base.m_prepared;
                                                  add1.super_statement_base.m_prepared = psVar1;
                                                  sqlib::database::~database((database *)&add1);
                                                  sqlib::database::~database((database *)&add2);
                                                  sqlite3_open(":memory:",&add2);
                                                  add1.super_statement_base.m_prepared =
                                                       add2.super_statement_base.m_prepared;
                                                  add2.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)0x0;
                                                  sqlib::database::~database((database *)&add1);
                                                  sqlib::database::~database((database *)&add2);
                                                  sqlite3_open(":memory:",&db1);
                                                  std::__cxx11::ostringstream::ostringstream
                                                            ((ostringstream *)&add2);
                                                  sqlib::database::enable_trace
                                                            (&db1,(ostream *)&add2);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&db1_1,"select ?1+?2",
                                                             (allocator<char> *)&db1_3);
                                                  sqlib::query<int>::query
                                                            (&add1,&db1,(string *)&db1_1);
                                                  std::__cxx11::string::~string((string *)&db1_1);
                                                  db1_1.m_sqlite._0_4_ = 3;
                                                  db1_3.m_sqlite._0_4_ = 5;
                                                  sqlib::query<int>::operator()
                                                            (&add1,(int *)&db1_1,(int *)&db1_3);
                                                  if (add1.m_has_data == false) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xf3);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,"has_data(query1)"
                                                                          );
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  else {
                                                    prVar5 = sqlib::query<int>::operator*(&add1);
                                                    if ((prVar5->super__Tuple_impl<0UL,_int>).
                                                        super__Head_base<0UL,_int,_false>.
                                                        _M_head_impl != 8) {
                                                      poVar4 = std::operator<<((ostream *)&std::cerr
                                                                               ,"Check failed on ");
                                                      poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xf3);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "std::get<0>(*query1) == 8");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::query<int>::operator++(&add1);
                                                  if (add1.m_has_data != true) {
                                                    std::__cxx11::stringbuf::str();
                                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&db1_1,"select 3+5\n");
                                                  std::__cxx11::string::~string((string *)&db1_1);
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xf6);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "os.str() == \"select 3+5\\n\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::database::disable_trace(&db1);
                                                  db1_1.m_sqlite._0_4_ = 1;
                                                  db1_3.m_sqlite._0_4_ = 2;
                                                  sqlib::query<int>::operator()
                                                            (&add1,(int *)&db1_1,(int *)&db1_3);
                                                  std::__cxx11::stringbuf::str();
                                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&db1_1,"select 3+5\n");
                                                  std::__cxx11::string::~string((string *)&db1_1);
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xfb);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "os.str() == \"select 3+5\\n\"");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::statement_base::~statement_base
                                                            (&add1.super_statement_base);
                                                  std::__cxx11::ostringstream::~ostringstream
                                                            ((ostringstream *)&add2);
                                                  sqlib::database::~database(&db1);
                                                  sqlite3_open(":memory:",&inserter_assign);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add2,
                                                                                                                          
                                                  "create table table1 (col1 integer, col2 text)",
                                                  (allocator<char> *)&add1);
                                                  sqlib::database::execute_sql
                                                            ((database *)&inserter_assign,
                                                             (string *)&add2);
                                                  std::__cxx11::string::~string((string *)&add2);
                                                  add1.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)
                                                       CONCAT44(add1.super_statement_base.m_prepared
                                                                ._4_4_,1);
                                                  std::
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::pair<int,_const_char_(&)[6],_true>
                                                            ((
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2,(int *)&add1,(char (*) [6])"first");
                                                  db1_1.m_sqlite._0_4_ = 2;
                                                  std::
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::pair<int,_const_char_(&)[7],_true>
                                                            ((
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)((long)&add2.super_statement_base.m_sql.field_2
                                                    + 8),(int *)&db1_1,(char (*) [7])"second");
                                                  db1_3.m_sqlite._0_4_ = 3;
                                                  std::
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::pair<int,_const_char_(&)[6],_true>
                                                            ((
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2.m_has_data,(int *)&db1_3,
                                                  (char (*) [6])"third");
                                                  __l._M_len = 3;
                                                  __l._M_array = (iterator)&add2;
                                                  std::
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::vector((
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&db1,__l,(allocator_type *)&db1_6);
                                                  lVar12 = 0x58;
                                                  do {
                                                    std::__cxx11::string::~string
                                                              ((string *)
                                                               ((long)&add2.super_statement_base.
                                                                       m_prepared + lVar12));
                                                    lVar12 = lVar12 + -0x28;
                                                  } while (lVar12 != -0x20);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add2,
                                                                                                                          
                                                  "insert into table1 (col1,col2) values(?1,?2)",
                                                  (allocator<char> *)&db1_1);
                                                  sqlib::statement_base::statement_base
                                                            (&add1.super_statement_base,
                                                             (database *)&inserter_assign,
                                                             (string *)&add2);
                                                  std::__cxx11::string::~string((string *)&add2);
                                                  for (dVar13 = db1;
                                                      dVar13.m_sqlite != (sqlite3 *)0x0;
                                                      dVar13.m_sqlite = dVar13.m_sqlite + 0x28) {
                                                    sqlib::statement::operator()
                                                              ((statement *)&add1,
                                                               (int *)dVar13.m_sqlite,
                                                               (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(dVar13.m_sqlite + 8));
                                                  }
                                                  db1_3.m_sqlite = (sqlite3 *)0x0;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&db1_1,
                                                             "select col1,col2 from table1",
                                                             (allocator<char> *)&db1_6);
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::query((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2,(database *)&inserter_assign,
                                                  (string *)&db1_1);
                                                  std::__cxx11::string::~string((string *)&db1_1);
                                                  pqVar10 = sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()<>((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  db1_6.m_sqlite =
                                                       (sqlite3 *)
                                                       (
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)0x0;
                                                  if (pqVar10->m_has_data != false) {
                                                    db1_6.m_sqlite = (sqlite3 *)pqVar10;
                                                  }
                                                  while (db1_6.m_sqlite != (sqlite3 *)0x0) {
                                                    pbVar6 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)sqlib::
                                                  row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator*((
                                                  row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_6);
                                                  std::
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                                            ((
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1,(int *)(pbVar6 + 1),pbVar6);
                                                  std::
                                                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                                  ::
                                                  emplace_back<std::pair<int,std::__cxx11::string>>
                                                            ((
                                                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                                  *)&db1_3,(
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&_Stack_2f0);
                                                  sqlib::
                                                  row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator++((
                                                  row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_6);
                                                  }
                                                  bVar2 = std::operator==((
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&db1,(
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&db1_3);
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0x110);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,"data == result");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~query((
                                                  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2);
                                                  std::
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::~vector((
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&db1_3);
                                                  sqlib::statement_base::~statement_base
                                                            (&add1.super_statement_base);
                                                  std::
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::~vector((
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&db1);
                                                  sqlib::database::~database
                                                            ((database *)&inserter_assign);
                                                  sqlite3_open(":memory:",&db1_12);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add2,
                                                                                                                          
                                                  "create table table1 (col1 integer, col2 text)",
                                                  (allocator<char> *)&add1);
                                                  sqlib::database::execute_sql
                                                            (&db1_12,(string *)&add2);
                                                  std::__cxx11::string::~string((string *)&add2);
                                                  add1.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)
                                                       CONCAT44(add1.super_statement_base.m_prepared
                                                                ._4_4_,1);
                                                  std::
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::pair<int,_const_char_(&)[6],_true>
                                                            ((
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2,(int *)&add1,(char (*) [6])"first");
                                                  db1_1.m_sqlite._0_4_ = 2;
                                                  std::
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::pair<int,_const_char_(&)[7],_true>
                                                            ((
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)((long)&add2.super_statement_base.m_sql.field_2
                                                    + 8),(int *)&db1_1,(char (*) [7])"second");
                                                  db1.m_sqlite._0_4_ = 3;
                                                  std::
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::pair<int,_const_char_(&)[6],_true>
                                                            ((
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&add2.m_has_data,(int *)&db1,
                                                  (char (*) [6])"third");
                                                  __l_00._M_len = 3;
                                                  __l_00._M_array = (iterator)&add2;
                                                  std::
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::vector((
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&db1_3,__l_00,(allocator_type *)&inserter_assign
                                                  );
                                                  lVar12 = 0x58;
                                                  do {
                                                    std::__cxx11::string::~string
                                                              ((string *)
                                                               ((long)&add2.super_statement_base.
                                                                       m_prepared + lVar12));
                                                    lVar12 = lVar12 + -0x28;
                                                  } while (lVar12 != -0x20);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&add2,
                                                                                                                          
                                                  "insert into table1 (col1,col2) values(?1,?2)",
                                                  (allocator<char> *)&db1_1);
                                                  sqlib::statement_base::statement_base
                                                            (&add1.super_statement_base,&db1_12,
                                                             (string *)&add2);
                                                  std::__cxx11::string::~string((string *)&add2);
                                                  for (dVar13 = db1_3;
                                                      dVar13.m_sqlite != (sqlite3 *)0x0;
                                                      dVar13.m_sqlite = dVar13.m_sqlite + 0x28) {
                                                    sqlib::statement::operator()
                                                              ((statement *)&add1,
                                                               (int *)dVar13.m_sqlite,
                                                               (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(dVar13.m_sqlite + 8));
                                                  }
                                                  inserter_assign.super_statement_base.m_prepared =
                                                       (sqlite3_stmt *)0x0;
                                                  inserter_assign.super_statement_base.m_db =
                                                       (sqlite3 *)0x0;
                                                  inserter_assign.super_statement_base.m_sql.
                                                  _M_dataplus._M_p = (pointer)0x0;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&db1_1,
                                                             "select col1,col2 from table1",
                                                             (allocator<char> *)&db1);
                                                  sqlib::dynquery::dynquery
                                                            ((dynquery *)&add2,&db1_12,
                                                             (string *)&db1_1);
                                                  std::__cxx11::string::~string((string *)&db1_1);
                                                  pdVar11 = sqlib::dynquery::operator()<>
                                                                      ((dynquery *)&add2);
                                                  __begin1_1.m_query = (dynquery *)0x0;
                                                  if (pdVar11->m_has_data != false) {
                                                    __begin1_1.m_query = pdVar11;
                                                  }
                                                  while (__begin1_1.m_query != (dynquery *)0x0) {
                                                    dVar14 = sqlib::dynrow_iterator::operator*
                                                                       (&__begin1_1);
                                                    db1_6.m_sqlite = (sqlite3 *)dVar14.m_prepared;
                                                    db1.m_sqlite = (sqlite3 *)local_318;
                                                    local_318[0]._M_allocated_capacity =
                                                         local_318[0]._M_allocated_capacity &
                                                         0xffffffffffffff00;
                                                    sqlib::dynrow::get<int,std::__cxx11::string>
                                                              ((dynrow *)&db1_6,&col1,
                                                               (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&db1);
                                                  db1_1.m_sqlite._0_4_ = col1;
                                                  std::__cxx11::string::string
                                                            ((string *)&_Stack_2f0,(string *)&db1);
                                                  std::
                                                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                                  ::
                                                  emplace_back<std::pair<int,std::__cxx11::string>>
                                                            ((
                                                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                                  *)&inserter_assign,
                                                  (
                                                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&db1_1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&_Stack_2f0);
                                                  std::__cxx11::string::~string((string *)&db1);
                                                  sqlib::dynrow_iterator::operator++(&__begin1_1);
                                                  }
                                                  bVar2 = std::operator==((
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&db1_3,(
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&inserter_assign);
                                                  if (!bVar2) {
                                                    poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                             "Check failed on ");
                                                    poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0x129);
                                                  poVar4 = std::operator<<(poVar4,"\n   ");
                                                  poVar4 = std::operator<<(poVar4,"data == result");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  sqlib::statement_base::~statement_base
                                                            (&add2.super_statement_base);
                                                  std::
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::~vector((
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&inserter_assign);
                                                  sqlib::statement_base::~statement_base
                                                            (&add1.super_statement_base);
                                                  std::
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::~vector((
                                                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&db1_3);
                                                  sqlib::database::~database(&db1_12);
                                                  return 0;
                                                  }
                                                  poVar4 = std::operator<<((ostream *)&std::cerr,
                                                                           "Check failed on ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
                                                  );
                                                  poVar4 = std::operator<<(poVar4,':');
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<
                                                                     ((ostream *)poVar4,0xf4);
                                                  poVar4 = std::operator<<(poVar4," (fatal)\n   ");
                                                  poVar4 = std::operator<<(poVar4,
                                                  "!has_data(query1)");
                                                  std::operator<<(poVar4,"\n");
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  exit(1);
}

Assistant:

int main() {
  const char * const table_def = "create table table1 (col1 integer, col2 text)";
  const char * const table_def2 = "create table table1 (col1 integer, col2 blob)";

  {
    database db1(":memory:");

    query<int> add1(db1, "select ?1+?2");
    add1(3,4);

    SQLIB_CHECK(has_data(add1) == true);
    CHECK_ROW1(add1, 7);

    query<string> add2(db1, "select ?1+?2");
    add2(3,4);
    SQLIB_CHECK(has_data(add2) == true);
    CHECK_ROW1(add2, "7");
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    query<int,string> query1(db1, "select col1,col2 from table1");
    query1();

    SQLIB_CHECK(has_data(query1) == false);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");

    insert1(1,"first")(2,"second")(3,"third");

    query<int,string> query1(db1, "select col1,col2 from table1 order by col1 asc");
    query1();
    CHECK_ROW2(query1, 1, "first");
    CHECK_ROW2(query1, 2, "second");
    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");

    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    insert(1,"first")(2,"second")(3,"third");

    statement update1(db1, "update table1 set col2=?1 where col1=?2");
    SQLIB_CHECK(update1("uno",1).affected_rows() == 1);
    SQLIB_CHECK(update1("dos",2).affected_rows() == 1);
    SQLIB_CHECK(update1("tres",3).affected_rows() == 1);

    query<int,string> query1(db1, "select col1, col2 from table1 order by col1 asc");
    query1();
    CHECK_ROW2(query1, 1, "uno");
    CHECK_ROW2(query1, 2, "dos");
    CHECK_ROW2(query1, 3, "tres");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");

    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    insert(1,"first")(2,"second")(3,"third");

    statement delete1(db1, "delete from table1 where col2=?1");
    SQLIB_CHECK(delete1("third").affected_rows() == 1);

    query<string> query1(db1, "select col2 from table1 order by col1 asc");
    query1();

    SQLIB_REQUIRE(has_data(query1));
    CHECK_ROW1(query1, "first");
    CHECK_ROW1(query1, "second");
    CHECK_DONE(query1);

    SQLIB_CHECK(delete1("first").affected_rows() == 1);
    SQLIB_CHECK(delete1("second").affected_rows() == 1);

    query1();
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query<int> query1(db1, "select col1 from table1 order by col1 asc");

    {
      // Start a transaction
      transaction_lock lock(db1);
      SQLIB_CHECK(insert(1,"first").affected_rows() == 1);
      SQLIB_CHECK(insert(2,"second").affected_rows() == 1);

      query1();
      CHECK_ROW1(query1, 1);
      CHECK_ROW1(query1, 2);
      CHECK_DONE(query1);

      // Leave scope without commit
    }

    query1();
    CHECK_DONE(query1);

    {
      // Start another transaction
      transaction_lock lock(db1);
      insert(1,"first");

      query1();
      CHECK_ROW1(query1, 1);
      CHECK_DONE(query1);

      query1();
      lock.commit();

      CHECK_ROW1(query1, 1);
      CHECK_DONE(query1);
    }

    query1();
    CHECK_ROW1(query1, 1);
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    typedef query<int,string> query_t;

    statement inserter(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query_t query1(db1, "select col1,col2 from table1 order by col1 asc");

    inserter(1,"first");

    statement inserter_copy = inserter;
    inserter_copy(2,"second");

    statement inserter_assign;
    inserter_assign = inserter;
    inserter_assign(3,"third");

    query1();
    CHECK_ROW2(query1, 1, "first");
    CHECK_ROW2(query1, 2, "second");
    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);

    query1();
    CHECK_ROW2(query1, 1, "first");

    query_t query_copy = query1;
    CHECK_DONE(query_copy);

    CHECK_ROW2(query1, 2, "second");

    query_copy();
    CHECK_ROW2(query_copy, 1, "first");
    CHECK_ROW2(query_copy, 2, "second");
    CHECK_ROW2(query_copy, 3, "third");
    CHECK_DONE(query_copy);

    query_t query_assignment;
    query_assignment = query1;
    CHECK_DONE(query_assignment);

    query_assignment();
    CHECK_ROW2(query_assignment, 1, "first");
    CHECK_ROW2(query_assignment, 2, "second");
    CHECK_ROW2(query_assignment, 3, "third");
    CHECK_DONE(query_assignment);

    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def2);

    typedef query<int,blob_type> query_t;

    statement inserter(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query_t query1(db1, "select col1,col2 from table1 order by col1 asc");

    // Prepare the blob with some data
    blob_type blob, empty_blob;
    for(int i = 0; i != 256; ++i)
      blob.push_back(static_cast<char>(i));

    inserter(1, blob);
    inserter(2, empty_blob);

    query1();
    CHECK_ROW2(query1, 1, blob);
    CHECK_ROW2(query1, 2, empty_blob);
    CHECK_DONE(query1);
  }

  // move assignment operator
  {
    database db1(":memory:"), db2(":memory:");
    db1 = std::move(db2);
  }

  // move copy constructor
  {
    database db1(":memory:");
    database db2(std::move(db1));
  }

  // trace test
  {
    database db1(":memory:");

    std::ostringstream os;
    db1.enable_trace(os);

    query<int> query1(db1, "select ?1+?2");
    query1(3,5);

    CHECK_ROW1(query1, 8);
    CHECK_DONE(query1);

    SQLIB_CHECK(os.str() == "select 3+5\n");

    db1.disable_trace();
    query1(1,2);

    SQLIB_CHECK(os.str() == "select 3+5\n");
  }

  // range test
  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    std::vector<std::pair<int, string>> data =
      {{1, "first"}, {2, "second"}, {3, "third"}};

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");
    for(const auto& row : data)
      insert1(row.first, row.second);

    decltype (data) result;

    query<int,string> query1(db1, "select col1,col2 from table1");
    for(const auto& row : query1())
      result.push_back({ std::get<0>(row), std::get<1>(row) });

    SQLIB_CHECK(data == result);
  }

  // dynquery test
  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    std::vector<std::pair<int, string>> data =
      {{1, "first"}, {2, "second"}, {3, "third"}};

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");
    for(const auto& row : data)
      insert1(row.first, row.second);

    decltype (data) result;

    dynquery query1(db1, "select col1,col2 from table1");
    for(auto row : query1()) {
      int col1;
      string col2;
      row.get(col1, col2);
      result.push_back({col1, col2});
    }

    SQLIB_CHECK(data == result);
  }

  return 0;
}